

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O2

int get_digit(NJDNode *node,int convert_flag)

{
  int iVar1;
  char *pcVar2;
  char *__s2;
  ulong uVar3;
  
  pcVar2 = NJDNode_get_string(node);
  if ((*pcVar2 != '*') || (pcVar2[1] != '\0')) {
    pcVar2 = NJDNode_get_pos_group1(node);
    iVar1 = strcmp(pcVar2,anon_var_dwarf_ec792 + 9);
    if (iVar1 == 0) {
      for (uVar3 = 0xffffffffffffff8e; 2 < uVar3; uVar3 = uVar3 + 3) {
        pcVar2 = njd_set_digit_rule_numeral_list1[uVar3 + 0x72];
        __s2 = NJDNode_get_string(node);
        iVar1 = strcmp(pcVar2,__s2);
        if (iVar1 == 0) {
          if (convert_flag == 1) {
            pcVar2 = njd_set_digit_rule_numeral_list1[uVar3 + 0x74];
            NJDNode_set_string(node,pcVar2);
            NJDNode_set_orig(node,pcVar2);
          }
          iVar1 = atoi(njd_set_digit_rule_numeral_list1[uVar3 + 0x73]);
          return iVar1;
        }
      }
    }
  }
  return -1;
}

Assistant:

static int get_digit(NJDNode * node, int convert_flag)
{
   int i;

   if (strcmp(NJDNode_get_string(node), "*") == 0)
      return -1;

   if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_DIGIT_KAZU) == 0)
      for (i = 0; njd_set_digit_rule_numeral_list1[i] != NULL; i += 3)
         if (strcmp(njd_set_digit_rule_numeral_list1[i], NJDNode_get_string(node)) == 0) {
            if (convert_flag == 1) {
               NJDNode_set_string(node, (char *) njd_set_digit_rule_numeral_list1[i + 2]);
               NJDNode_set_orig(node, (char *) njd_set_digit_rule_numeral_list1[i + 2]);
            }
            return atoi(njd_set_digit_rule_numeral_list1[i + 1]);
         }

   return -1;
}